

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O3

char * BinaryCache::FindBytecode(char *moduleName,bool addExtension)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  uint uVar5;
  char path [1024];
  char acStack_438 [1032];
  
  if ((int)CONCAT71(in_register_00000031,addExtension) == 0) {
    uVar5 = NULLC::GetStringHash(moduleName);
    if (uVar5 == lastHash) {
      return lastBytecode;
    }
    pcVar2 = strstr(moduleName,".nc");
    if (pcVar2 == (char *)0x0) {
      __assert_fail("strstr(moduleName, \".nc\") != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                    ,0xb4,"const char *BinaryCache::FindBytecode(const char *, bool)");
    }
  }
  else {
    pcVar2 = strstr(moduleName,".nc");
    if (pcVar2 != (char *)0x0) {
      __assert_fail("strstr(moduleName, \".nc\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                    ,0xb2,"const char *BinaryCache::FindBytecode(const char *, bool)");
    }
  }
  uVar5 = 0;
  do {
    if ((DAT_0041ef3c <= uVar5) ||
       (pcVar2 = *(char **)(importPaths + (ulong)uVar5 * 8), pcVar2 == (char *)0x0)) {
      return (char *)0x0;
    }
    iVar1 = NULLC::SafeSprintf(acStack_438,0x400,"%s%s",pcVar2,moduleName);
    if (addExtension) {
      sVar3 = strlen(pcVar2);
      pcVar2 = acStack_438 + sVar3;
      sVar3 = strlen(pcVar2);
      if ((int)sVar3 != 0) {
        uVar4 = 0;
        do {
          if (pcVar2[uVar4] == '.') {
            pcVar2[uVar4] = '/';
          }
          uVar4 = uVar4 + 1;
        } while ((sVar3 & 0xffffffff) != uVar4);
      }
      NULLC::SafeSprintf(acStack_438 + iVar1,(ulong)(0x400 - iVar1),".nc");
    }
    uVar5 = uVar5 + 1;
    pcVar2 = GetBytecode(acStack_438);
  } while (pcVar2 == (char *)0x0);
  return pcVar2;
}

Assistant:

const char*	BinaryCache::FindBytecode(const char* moduleName, bool addExtension)
{
	if(!addExtension)
	{
		unsigned int hash = NULLC::GetStringHash(moduleName);

		if(hash == lastHash)
			return lastBytecode;
	}

	if(addExtension)
		assert(strstr(moduleName, ".nc") == 0);
	else
		assert(strstr(moduleName, ".nc") != 0);

	const unsigned pathLength = 1024;
	char path[pathLength];

	unsigned modulePathPos = 0;
	while(const char *modulePath = BinaryCache::EnumImportPath(modulePathPos++))
	{
		char *pathEnd = path + NULLC::SafeSprintf(path, pathLength, "%s%s", modulePath, moduleName);

		if(addExtension)
		{
			char *pathNoImport = path + strlen(modulePath);

			for(unsigned i = 0, e = (unsigned)strlen(pathNoImport); i != e; i++)
			{
				if(pathNoImport[i] == '.')
					pathNoImport[i] = '/';
			}

			NULLC::SafeSprintf(pathEnd, pathLength - int(pathEnd - path), ".nc");
		}

		if(const char *bytecode = BinaryCache::GetBytecode(path))
			return bytecode;
	}

	return NULL;
}